

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2any.c
# Opt level: O0

int dsa_pki_priv_to_der(void *dsa,uchar **pder)

{
  BIGNUM *bn_00;
  ASN1_INTEGER *a;
  uchar **in_RSI;
  DSA *in_RDI;
  int ret;
  ASN1_INTEGER *priv_key;
  BIGNUM *bn;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int line;
  undefined4 local_4;
  
  line = 0;
  bn_00 = DSA_get0_priv_key(in_RDI);
  if (bn_00 == (BIGNUM *)0x0) {
    ERR_new();
    ERR_set_debug((char *)bn_00,line,
                  (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    ERR_set_error(0x39,0xdd,(char *)0x0);
    local_4 = 0;
  }
  else {
    a = BN_to_ASN1_INTEGER((BIGNUM *)bn_00,(ASN1_INTEGER *)0x0);
    if (a == (ASN1_INTEGER *)0x0) {
      ERR_new();
      ERR_set_debug((char *)bn_00,(int)((ulong)a >> 0x20),
                    (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      ERR_set_error(0x39,0xa0,(char *)0x0);
      local_4 = 0;
    }
    else {
      local_4 = i2d_ASN1_INTEGER(a,in_RSI);
      ASN1_STRING_clear_free((ASN1_STRING *)0x31dc23);
    }
  }
  return local_4;
}

Assistant:

static int dsa_pki_priv_to_der(const void *dsa, unsigned char **pder)
{
    const BIGNUM *bn = NULL;
    ASN1_INTEGER *priv_key = NULL;
    int ret;

    if ((bn = DSA_get0_priv_key(dsa)) == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_NOT_A_PRIVATE_KEY);
        return 0;
    }
    if ((priv_key = BN_to_ASN1_INTEGER(bn, NULL)) == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_BN_ERROR);
        return 0;
    }

    ret = i2d_ASN1_INTEGER(priv_key, pder);

    ASN1_STRING_clear_free(priv_key);
    return ret;
}